

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O2

void __thiscall cppcms::impl::cgi::http::~http(http *this)

{
  int iVar1;
  error_code e;
  
  (this->super_connection)._vptr_connection = (_func_int **)&PTR__http_002b8d48;
  iVar1 = booster::aio::basic_io_device::native();
  if (iVar1 != -1) {
    e._M_value = 0;
    e._M_cat = (error_category *)std::_V2::system_category();
    booster::aio::stream_socket::shutdown(&this->socket_,2,&e);
  }
  std::__cxx11::string::~string((string *)&this->remote_ip_);
  std::__cxx11::string::~string((string *)&this->ip_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->rewrite_).
              super___shared_ptr<cppcms::impl::url_rewriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->watchdog_).
              super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&this->chunked_header_);
  std::__cxx11::string::~string((string *)&this->response_headers_);
  cppcms::http::impl::parser::~parser(&this->input_parser_);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->input_body_).super__Vector_base<char,_std::allocator<char>_>);
  booster::aio::stream_socket::~stream_socket(&this->socket_);
  connection::~connection(&this->super_connection);
  return;
}

Assistant:

~http()
		{
			if(socket_.native()!=io::invalid_socket) {
				booster::system::error_code e;
				socket_.shutdown(io::stream_socket::shut_rdwr,e);
			}
		}